

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O0

void google::protobuf::anon_unknown_6::ReportReflectionUsageMessageError
               (Descriptor *expected,Descriptor *actual,FieldDescriptor *field,char *method)

{
  LogMessage *pLVar1;
  string_view local_b0;
  string_view local_a0;
  string_view local_90 [2];
  FormatSpecTemplate<(absl::lts_20250127::FormatConversionCharSet)262148,_(absl::lts_20250127::FormatConversionCharSet)524292,_(absl::lts_20250127::FormatConversionCharSet)524292,_(absl::lts_20250127::FormatConversionCharSet)524292>
  local_70;
  string local_60;
  LogMessage local_40;
  Voidify local_29;
  char *local_28;
  char *method_local;
  FieldDescriptor *field_local;
  Descriptor *actual_local;
  Descriptor *expected_local;
  
  local_28 = method;
  method_local = (char *)field;
  field_local = (FieldDescriptor *)actual;
  actual_local = expected;
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_40,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_reflection.cc"
             ,0xe1);
  pLVar1 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_40);
  absl::lts_20250127::str_format_internal::
  FormatSpecTemplate<(absl::lts_20250127::FormatConversionCharSet)262148,_(absl::lts_20250127::FormatConversionCharSet)524292,_(absl::lts_20250127::FormatConversionCharSet)524292,_(absl::lts_20250127::FormatConversionCharSet)524292>
  ::FormatSpecTemplate
            (&local_70,
             "Protocol Buffer reflection usage error:\n  Method       : google::protobuf::Reflection::%s\n  Expected type: %s\n  Actual type  : %s\n  Field        : %s\n  Problem      : Message is not the right object for reflection"
            );
  local_90[0] = Descriptor::full_name(actual_local);
  local_a0 = Descriptor::full_name((Descriptor *)field_local);
  if (method_local == (char *)0x0) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_b0,"n/a");
  }
  else {
    local_b0 = FieldDescriptor::full_name((FieldDescriptor *)method_local);
  }
  absl::lts_20250127::
  StrFormat<const_char_*,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
            (&local_60,&local_70,&local_28,local_90,&local_a0,&local_b0);
  pLVar1 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar1,&local_60);
  absl::lts_20250127::log_internal::Voidify::operator&&(&local_29,pLVar1);
  std::__cxx11::string::~string((string *)&local_60);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_40);
}

Assistant:

void ReportReflectionUsageMessageError(const Descriptor* expected,
                                       const Descriptor* actual,
                                       const FieldDescriptor* field,
                                       const char* method) {
  ABSL_LOG(FATAL) << absl::StrFormat(
      "Protocol Buffer reflection usage error:\n"
      "  Method       : google::protobuf::Reflection::%s\n"
      "  Expected type: %s\n"
      "  Actual type  : %s\n"
      "  Field        : %s\n"
      "  Problem      : Message is not the right object for reflection",
      method, expected->full_name(), actual->full_name(),
      (field != nullptr ? field->full_name() : "n/a"));
}